

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

long __thiscall
divsufsortxx::core::sort_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
          (core *this,char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long SAsize,
          int alphabetsize)

{
  core *pcVar1;
  core *pcVar2;
  iterator last;
  iterator last_00;
  iterator buf;
  ulong uVar3;
  long lVar4;
  pos_type pVar5;
  pos_type pVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  undefined8 uVar11;
  core cVar12;
  void *__s;
  long lVar13;
  core *pcVar14;
  BitmapArray<long> *pBVar15;
  ulong uVar16;
  long lVar17;
  long *plVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long *plVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  iterator first;
  iterator first_00;
  iterator PA;
  iterator PA_00;
  iterator first_01;
  iterator first_02;
  iterator ISA;
  iterator ISA_00;
  iterator last_01;
  iterator last_02;
  long local_e0;
  
  __s = (void *)SA.pos_;
  pBVar15 = SA.array_;
  lVar22 = (long)(int)SAsize;
  if (lVar22 < 1) {
    if ((int)SAsize == 0) goto LAB_00104c7d;
  }
  else {
    memset(__s,0,lVar22 * 8);
  }
  memset(bucket_A,0,(ulong)((int)SAsize * (int)SAsize + (uint)((int)SAsize * (int)SAsize == 0)) << 3
        );
LAB_00104c7d:
  uVar26 = (long)bucket_B - 1;
  uVar16 = uVar26;
  lVar24 = n;
  if (0 < (long)bucket_B) {
    while( true ) {
      cVar12 = this[uVar16];
      uVar3 = uVar16;
      do {
        uVar19 = uVar3;
        uVar16 = uVar16 - 1;
        plVar23 = (long *)((long)__s + (long)(char)cVar12 * 8);
        *plVar23 = *plVar23 + 1;
        if (uVar19 == 0) goto LAB_00104d66;
        cVar12 = this[uVar19 - 1];
        uVar3 = uVar19 - 1;
      } while ((char)this[uVar19] <= (char)cVar12);
      bucket_A[(char)cVar12 * (int)SAsize + (int)(char)this[uVar19]] =
           bucket_A[(char)cVar12 * (int)SAsize + (int)(char)this[uVar19]] + 1;
      lVar20 = lVar24 + -1;
      lVar24 = lVar24 + -1;
      (**(code **)(*(long *)T + 0x20))(T,(long)pBVar15 + lVar20,uVar19 - 1);
      if ((long)uVar19 < 2) break;
      while( true ) {
        if ((char)this[uVar16] < (char)this[uVar16 - 1]) break;
        bucket_A[(char)this[uVar16] * (int)SAsize + (int)(char)this[uVar16 - 1]] =
             bucket_A[(char)this[uVar16] * (int)SAsize + (int)(char)this[uVar16 - 1]] + 1;
        uVar16 = uVar16 - 1;
        if ((long)uVar16 < 1) goto LAB_00104d66;
      }
      uVar16 = uVar16 - 1;
    }
  }
LAB_00104d66:
  lVar24 = n - lVar24;
  if (0 < (int)SAsize) {
    uVar3 = SAsize & 0xffffffff;
    plVar23 = bucket_A + 1;
    plVar18 = bucket_A + uVar3;
    lVar20 = -1;
    uVar19 = 0;
    lVar21 = 0;
    uVar16 = uVar3;
    do {
      uVar16 = uVar16 - 1;
      lVar4 = *(long *)((long)__s + uVar19 * 8);
      *(long *)((long)__s + uVar19 * 8) = lVar20 + lVar21;
      lVar20 = lVar4 + lVar20 + bucket_A[uVar19 + (uint)((int)uVar19 * (int)SAsize)];
      uVar19 = uVar19 + 1;
      if ((long)uVar19 < lVar22) {
        uVar25 = 0;
        plVar9 = plVar18;
        do {
          lVar21 = lVar21 + plVar23[uVar25];
          plVar23[uVar25] = lVar21;
          lVar20 = lVar20 + *plVar9;
          uVar25 = uVar25 + 1;
          plVar9 = plVar9 + uVar3;
        } while (uVar16 != uVar25);
      }
      plVar23 = plVar23 + uVar3 + 1;
      plVar18 = plVar18 + uVar3 + 1;
    } while (uVar19 != uVar3);
  }
  if (0 < lVar24) {
    if (lVar24 != 1) {
      lVar20 = lVar24 + -2;
      lVar21 = (long)pBVar15 + n + -2;
      do {
        lVar4 = (**(code **)(*(long *)T + 0x28))(T,lVar21);
        lVar13 = (long)(char)this[lVar4] * (long)(int)SAsize + (long)(char)this[lVar4 + 1];
        lVar4 = bucket_A[lVar13];
        bucket_A[lVar13] = lVar4 + -1;
        (**(code **)(*(long *)T + 0x20))(T,lVar4 + -1 + (long)pBVar15,lVar20);
        lVar21 = lVar21 + -1;
        bVar27 = lVar20 != 0;
        lVar20 = lVar20 + -1;
      } while (bVar27);
    }
    pVar5 = (long)pBVar15 + (n - lVar24);
    pVar6 = (long)pBVar15 + lVar24;
    lVar20 = lVar24 + -1;
    lVar21 = (**(code **)(*(long *)T + 0x28))(T,(long)pBVar15 + n + -1);
    lVar4 = (long)(char)this[lVar21] * (long)(int)SAsize + (long)(char)this[lVar21 + 1];
    lVar21 = bucket_A[lVar4];
    bucket_A[lVar4] = lVar21 + -1;
    (**(code **)(*(long *)T + 0x20))(T,lVar21 + -1 + (long)pBVar15,lVar20);
    lVar21 = n + lVar24 * -2;
    local_e0 = lVar20;
    if (lVar21 < 0x101) {
      plVar9 = (long *)operator_new__(0x800);
      lVar17 = (long)((int)SAsize + -1);
      plVar23 = (long *)((lVar22 * 8 + 8) * lVar17 + (long)bucket_A);
      lVar21 = lVar17;
      lVar4 = lVar24;
      lVar13 = lVar17;
      plVar18 = plVar23;
      do {
        for (; lVar13 < lVar21; lVar21 = lVar21 + -1) {
          lVar7 = *plVar23;
          if (1 < lVar4 - lVar7) {
            lVar10 = (**(code **)(*(long *)T + 0x28))();
            last_00.pos_ = (long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar4;
            last_00.array_ = (BitmapArray<long> *)T;
            PA_00.pos_ = pVar5;
            PA_00.array_ = (BitmapArray<long> *)T;
            first_02.pos_ = (long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar7;
            first_02.array_ = (BitmapArray<long> *)T;
            substring::sort<char*,bitmap::BitmapArray<long>::iterator,long*>
                      ((char *)this,PA_00,first_02,last_00,plVar9,0x100,2,(value_type)bucket_B,
                       lVar10 == lVar20,0x400);
          }
          plVar23 = plVar23 + -1;
          lVar4 = lVar7;
        }
        lVar13 = lVar13 + -1;
        plVar23 = plVar18 + -lVar22;
        lVar21 = lVar17;
        plVar18 = plVar23;
      } while (0 < lVar4);
      operator_delete__(plVar9);
    }
    else {
      lVar7 = (long)((int)SAsize + -1);
      plVar23 = (long *)((lVar22 * 8 + 8) * lVar7 + (long)bucket_A);
      lVar4 = lVar7;
      lVar13 = lVar24;
      plVar18 = plVar23;
      lVar17 = lVar7;
      do {
        for (; lVar17 < lVar4; lVar4 = lVar4 + -1) {
          lVar10 = *plVar23;
          if (1 < lVar13 - lVar10) {
            lVar8 = (**(code **)(*(long *)T + 0x28))(T);
            last.pos_ = (long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar13;
            last.array_ = (BitmapArray<long> *)T;
            buf.pos_ = pVar6;
            buf.array_ = (BitmapArray<long> *)T;
            PA.pos_ = pVar5;
            PA.array_ = (BitmapArray<long> *)T;
            first_01.pos_ = (long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar10;
            first_01.array_ = (BitmapArray<long> *)T;
            substring::
            sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      ((char *)this,PA,first_01,last,buf,lVar21,2,(value_type)bucket_B,
                       lVar8 == lVar20,0x400);
          }
          plVar23 = plVar23 + -1;
          lVar13 = lVar10;
        }
        lVar17 = lVar17 + -1;
        plVar23 = plVar18 + -lVar22;
        lVar4 = lVar7;
        plVar18 = plVar23;
      } while (0 < lVar13);
    }
    do {
      lVar21 = (**(code **)(*(long *)T + 0x28))
                         (T,(long)&(pBVar15->super_Bitmap)._vptr_Bitmap + local_e0);
      if (-1 < lVar21) {
        lVar21 = -1;
        do {
          lVar17 = local_e0;
          lVar13 = lVar21;
          lVar4 = (long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar17;
          lVar21 = (**(code **)(*(long *)T + 0x28))(T,lVar4);
          (**(code **)(*(long *)T + 0x20))(T,lVar21 + pVar6,lVar17);
          if (lVar17 < 1) break;
          lVar7 = (**(code **)(*(long *)T + 0x28))(T,(long)pBVar15 + lVar17 + -1);
          lVar21 = lVar13 + -1;
          local_e0 = lVar17 + -1;
        } while (-1 < lVar7);
        (**(code **)(*(long *)T + 0x20))(T,lVar4,lVar13);
        if (lVar17 < 2) break;
        local_e0 = lVar17 + -1;
      }
      lVar21 = local_e0 + -1;
      do {
        lVar13 = lVar21;
        lVar21 = (long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar13 + 1;
        uVar16 = (**(code **)(*(long *)T + 0x28))(T,lVar21);
        (**(code **)(*(long *)T + 0x20))(T,lVar21,~uVar16);
        lVar21 = (**(code **)(*(long *)T + 0x28))(T,lVar21);
        (**(code **)(*(long *)T + 0x20))(T,lVar21 + pVar6,local_e0);
        lVar4 = (**(code **)(*(long *)T + 0x28))
                          (T,(long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar13);
        lVar21 = lVar13 + -1;
      } while (lVar4 < 0);
      lVar21 = (**(code **)(*(long *)T + 0x28))
                         (T,(long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar13);
      (**(code **)(*(long *)T + 0x20))(T,lVar21 + pVar6,local_e0);
      local_e0 = lVar13 + -1;
    } while (1 < lVar13 + 1);
    first.pos_ = (pos_type)pBVar15;
    first.array_ = (BitmapArray<long> *)T;
    ISA.pos_ = pVar6;
    ISA.array_ = (BitmapArray<long> *)T;
    last_01.pos_ = pVar6;
    last_01.array_ = (BitmapArray<long> *)T;
    bVar27 = tandemrepeat::
             sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                       (ISA,first,last_01);
    if (!bVar27) {
      first_00.pos_ = (pos_type)pBVar15;
      first_00.array_ = (BitmapArray<long> *)T;
      ISA_00.pos_ = pVar6;
      ISA_00.array_ = (BitmapArray<long> *)T;
      last_02.pos_ = pVar6;
      last_02.array_ = (BitmapArray<long> *)T;
      doubling::sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (ISA_00,first_00,last_02);
    }
    lVar21 = lVar24;
    uVar16 = uVar26;
    if (0 < (long)bucket_B) {
      while( true ) {
        pcVar14 = this;
        uVar3 = 0;
        do {
          uVar19 = uVar3;
          if (uVar19 == uVar16) goto LAB_00105489;
          pcVar2 = pcVar14 + (uVar16 - 1);
          pcVar1 = pcVar14 + uVar16;
          pcVar14 = pcVar14 + -1;
          uVar3 = uVar19 + 1;
        } while ((char)*pcVar1 <= (char)*pcVar2);
        lVar4 = (**(code **)(*(long *)T + 0x28))(T,lVar21 + pVar6 + -1);
        lVar13 = uVar16 - (uVar19 + 1);
        (**(code **)(*(long *)T + 0x20))
                  (T,(long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar4,lVar13);
        if (lVar13 + 1 < 2) break;
        lVar4 = uVar16 + ~uVar19;
        while ((char)this[lVar4 + -1] <= (char)this[lVar4]) {
          lVar4 = lVar4 + -1;
          if (lVar4 < 1) goto LAB_00105489;
        }
        lVar21 = lVar21 + -1;
        uVar16 = lVar4 - 1;
      }
    }
LAB_00105489:
    if (0 < (int)SAsize) {
      lVar21 = lVar22 + -1;
      do {
        if (lVar21 < (long)(ulong)((int)SAsize - 1)) {
          lVar4 = lVar22 + -1;
          do {
            uVar16 = uVar26 - bucket_A[lVar21 + lVar4 * lVar22];
            bucket_A[lVar21 + lVar4 * lVar22] = uVar26 + 1;
            lVar13 = bucket_A[lVar21 * lVar22 + lVar4];
            lVar17 = lVar20;
            if (lVar13 <= lVar20) {
              do {
                uVar11 = (**(code **)(*(long *)T + 0x28))
                                   (T,(long)&(pBVar15->super_Bitmap)._vptr_Bitmap + lVar17);
                (**(code **)(*(long *)T + 0x20))
                          (T,(long)&(pBVar15->super_Bitmap)._vptr_Bitmap + uVar16,uVar11);
                uVar16 = uVar16 - 1;
                lVar20 = lVar17 + -1;
                bVar27 = lVar13 < lVar17;
                lVar17 = lVar20;
              } while (bVar27);
            }
            lVar4 = lVar4 + -1;
            uVar26 = uVar16;
          } while (lVar21 < lVar4);
          lVar13 = (long)((int)lVar21 * (int)SAsize);
          lVar4 = bucket_A[lVar21 + lVar13];
          bucket_A[lVar21 + lVar13] = uVar16 + 1;
          if (lVar21 < (long)(ulong)((int)SAsize - 1)) {
            bucket_A[lVar21 + lVar21 * lVar22 + 1] = (uVar16 + 1) - lVar4;
          }
        }
        else {
          bucket_A[lVar21 + (int)lVar21 * (int)SAsize] = uVar26 + 1;
        }
        uVar26 = *(ulong *)((long)__s + lVar21 * 8);
        bVar27 = 0 < lVar21;
        lVar21 = lVar21 + -1;
      } while (bVar27);
    }
  }
  return lVar24;
}

Assistant:

pos_type sort_typeBstar(const StringIterator_type T, SAIterator_type SA,
                        pos_type *bucket_A, pos_type *bucket_B, pos_type n,
                        pos_type SAsize, alphabetsize_type alphabetsize) {
  pos_type i, j, k, t, m, bufsize;
  alphabetsize_type c0, c1;

  /* Initialize bucket arrays. */
  for (i = 0; i < alphabetsize; ++i) {
    bucket_A[i] = 0;
  }
  for (i = 0; i < alphabetsize * alphabetsize; ++i) {
    bucket_B[i] = 0;
  }

  /* Count the number of occurrences of the first one or two characters of each
   type A, B and B* suffix. Moreover, store the beginning position of all
   type B* suffixes into the array SA. */
  for (i = n - 1, m = SAsize; 0 <= i;) {
    /* type A suffix. */
    do {
      ++BUCKET_A(T[i]);
    } while ((0 <= --i) && (T[i] >= T[i + 1]));
    if (0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(T[i], T[i + 1]);
      SA[--m] = i;
      /* type B suffix. */
      for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        ++BUCKET_B(T[i], T[i + 1]);
      }
    }
  }
  m = SAsize - m;

  /* Calculate the index of start/end point of each bucket. */
  for (c0 = 0, i = -1, j = 0; c0 < alphabetsize; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0)= i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for (c1 = c0 + 1; c1 < alphabetsize; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if (0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    SAIterator_type PAb = SA + SAsize - m, ISAb = SA + m;
    for (i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
    bufsize = SAsize - 2 * m;
    if (MERGE_BUFSIZE < bufsize) {
      SAIterator_type buf = SA + m;
      for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
        for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
          i = BUCKET_BSTAR(c0, c1);
          if (1 < (j - i)) {
            substring::sort(T, PAb, SA + i, SA + j, buf, bufsize, 2, n,
                            *(SA + i) == (m - 1));
          }
        }
      }
    } else {
      pos_type *lbuf = NULL;
      int err = 0;
      try {
        lbuf = new pos_type[MERGE_BUFSIZE];
        if (lbuf == NULL) {
          throw;
        }
        for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
          for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if (1 < (j - i)) {
              substring::sort(T, PAb, SA + i, SA + j, lbuf, MERGE_BUFSIZE, 2, n,
                              *(SA + i) == (m - 1));
            }
          }
        }
      } catch (...) {
        err = -1;
      }
      delete[] lbuf;
      if (err != 0) {
        throw;
      }
    }

    /* Compute ranks of type B* substrings. */
    for (i = m - 1; 0 <= i; --i) {
      if (0 <= SA[i]) {
        j = i;
        do {
          ISAb[SA[i]] = i;
        } while ((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if (i <= 0) {
          break;
        }
      }
      j = i;
      do {
        ISAb[SA[i] = ~SA[i]] = j;
      } while (SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using tandemrepeat/doubling sorting algorithms. */
    if (tandemrepeat::sort(ISAb, SA, SA + m) == false) {
      doubling::sort(ISAb, SA, SA + m);
    }

    /* Set the sorted order of tyoe B* suffixes. */
    for (i = n - 1, j = m; 0 <= i;) {
      for (--i; (0 <= i) && (T[i] >= T[i + 1]); --i) {
      }
      if (0 <= i) {
        SA[ISAb[--j]] = i;
        for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        }
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    for (c0 = alphabetsize - 1, i = n - 1, k = m - 1; 0 <= c0; --c0) {
      for (c1 = alphabetsize - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i + 1; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for (i = t, j = BUCKET_BSTAR(c0, c1); j <= k; --i, --k) {
          SA[i] = SA[k];
        }
      }
      t = i - BUCKET_B(c0, c0);
      BUCKET_B(c0, c0) = i + 1; /* end point */
      if (c0 < (alphabetsize - 1)) {
        BUCKET_BSTAR(c0, c0 + 1) = t + 1; /* start point */
      }
      i = BUCKET_A(c0);
    }
  }

  return m;
}